

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

TProb<double> * __thiscall
libDAI::TProb<double>::log0(TProb<double> *__return_storage_ptr__,TProb<double> *this)

{
  double __x;
  pointer pdVar1;
  double in_RAX;
  size_t i;
  ulong uVar2;
  double dVar3;
  double local_28;
  
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (&__return_storage_ptr__->_p,
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  for (uVar2 = 0;
      pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
      uVar2 = uVar2 + 1) {
    __x = pdVar1[uVar2];
    dVar3 = 0.0;
    if ((__x != 0.0) || (NAN(__x))) {
      dVar3 = ::log(__x);
    }
    local_28 = dVar3;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&__return_storage_ptr__->_p,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

TProb<T> log0() const {
                TProb<T> l0;
                l0._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ )
                    l0._p.push_back( (_p[i] == 0.0) ? 0.0 : std::log( _p[i] ) );
                return l0;
            }